

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
BCL::
Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_void>
::get(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__,
     Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_void>
     *this)

{
  bool bVar1;
  element_type *dst;
  serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>
  local_4d [13];
  GlobalPtr<const_char> local_40;
  undefined1 local_30 [8];
  serial_ptr<char> local;
  Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_void>
  *this_local;
  
  local.N = (size_t)this;
  bVar1 = GlobalPtr<char>::operator!=(&this->ptr,(nullptr_t)0x0);
  if (bVar1) {
    serial_ptr<char>::serial_ptr((serial_ptr<char> *)local_30,this->len);
    local_40 = GlobalPtr<char>::operator_GlobalPtr<true,_nullptr>(&this->ptr);
    dst = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                    ((__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2> *)local_30);
    rget<char>(local_40,dst,this->len);
    serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>
    ::deserialize(__return_storage_ptr__,local_4d,(serial_ptr<char> *)local_30);
    serial_ptr<char>::~serial_ptr((serial_ptr<char> *)local_30);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

T get() const {
      if (ptr != nullptr) {
        serial_ptr <SPT> local(len);
        BCL::rget(this->ptr, local.ptr.get(), len);
        return Serialize{}.deserialize(local);
      } else {
        return T();
      }
    }